

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_interpolate.cpp
# Opt level: O0

void __thiscall
DWallScrollInterpolation::Interpolate(DWallScrollInterpolation *this,double smoothratio)

{
  double dVar1;
  double smoothratio_local;
  DWallScrollInterpolation *this_local;
  
  dVar1 = side_t::GetTextureXOffset(this->side,this->part);
  this->bakx = dVar1;
  dVar1 = side_t::GetTextureYOffset(this->side,this->part);
  this->baky = dVar1;
  if ((this->super_DInterpolation).refcount == 0) {
    if ((this->oldx == this->bakx) && (!NAN(this->oldx) && !NAN(this->bakx))) {
      if ((this->oldy == this->baky) && (!NAN(this->oldy) && !NAN(this->baky))) {
        (*(this->super_DInterpolation).super_DObject._vptr_DObject[4])();
        return;
      }
    }
  }
  side_t::SetTextureXOffset
            (this->side,this->part,this->oldx + (this->bakx - this->oldx) * smoothratio);
  side_t::SetTextureYOffset
            (this->side,this->part,this->oldy + (this->baky - this->oldy) * smoothratio);
  return;
}

Assistant:

void DWallScrollInterpolation::Interpolate(double smoothratio)
{
	bakx = side->GetTextureXOffset(part);
	baky = side->GetTextureYOffset(part);

	if (refcount == 0 && oldx == bakx && oldy == baky)
	{
		Destroy();
	}
	else
	{
		side->SetTextureXOffset(part, oldx + (bakx - oldx) * smoothratio);
		side->SetTextureYOffset(part, oldy + (baky - oldy) * smoothratio);
	}
}